

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_zlib_compress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGCompressSettings *settings)

{
  ulong uVar1;
  uchar uVar2;
  uchar *puVar3;
  uchar *puVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  size_t deflatesize;
  uchar *deflatedata;
  size_t local_70;
  uchar *local_68;
  ucvector local_60;
  uint local_44;
  uchar **local_40;
  ulong *local_38;
  
  local_68 = (uchar *)0x0;
  local_70 = 0;
  puVar4 = *out;
  uVar7 = *outsize;
  uVar5 = 0xffffffffffffffff;
  uVar13 = uVar7 + 1;
  puVar3 = puVar4;
  uVar1 = uVar7;
  local_40 = out;
  local_38 = outsize;
  if (uVar13 == 0) {
LAB_001228a2:
    local_60.allocsize = uVar1;
    puVar3[uVar7] = 'x';
    puVar4 = puVar3;
    uVar14 = uVar7 + 2;
    uVar7 = uVar5;
    local_60.data = puVar3;
    local_60.size = uVar13;
  }
  else {
    uVar5 = uVar13 * 3 >> 1;
    if (uVar7 * 2 < uVar13) {
      uVar5 = uVar13;
    }
    local_60.data = puVar4;
    local_60.size = uVar7;
    local_60.allocsize = uVar7;
    puVar3 = (uchar *)realloc(puVar4,uVar5);
    uVar14 = uVar13;
    uVar1 = uVar5;
    if (puVar3 != (uchar *)0x0) goto LAB_001228a2;
  }
  puVar3 = local_60.data;
  uVar5 = local_60.allocsize;
  if (uVar7 < uVar14) {
    uVar5 = uVar14 * 3 >> 1;
    if (uVar7 * 2 < uVar14) {
      uVar5 = uVar14;
    }
    puVar4 = (uchar *)realloc(puVar4,uVar5);
    puVar3 = puVar4;
    if (puVar4 == (uchar *)0x0) goto LAB_00122902;
  }
  local_60.allocsize = uVar5;
  local_60.data = puVar3;
  puVar4[uVar14 - 1] = '\x01';
  local_60.size = uVar14;
LAB_00122902:
  if (settings->custom_deflate ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
    local_44 = lodepng_deflate(&local_68,&local_70,in,insize,settings);
  }
  else {
    local_44 = (*settings->custom_deflate)(&local_68,&local_70,in,insize,settings);
  }
  if (local_44 == 0) {
    if ((int)insize == 0) {
      uVar11 = 1;
    }
    else {
      uVar11 = 1;
      uVar12 = 0;
      do {
        uVar15 = (uint)insize;
        uVar8 = 0x15ae;
        if (uVar15 < 0x15ae) {
          uVar8 = uVar15;
        }
        uVar9 = uVar15;
        if (0x15ad < (insize & 0xffffffff)) {
          uVar9 = 0x15ae;
        }
        lVar10 = 0;
        do {
          uVar11 = uVar11 + in[lVar10];
          uVar12 = uVar12 + uVar11;
          lVar10 = lVar10 + 1;
        } while (uVar9 != (uint)lVar10);
        in = in + uVar8;
        uVar11 = uVar11 % 0xfff1;
        uVar12 = uVar12 % 0xfff1;
        insize = (size_t)(uVar15 - uVar8);
      } while (uVar15 - uVar8 != 0);
      uVar11 = uVar12 << 0x10 | uVar11;
    }
    uVar7 = local_60.size;
    puVar4 = local_60.data;
    uVar5 = local_60.allocsize;
    if (local_70 != 0) {
      sVar6 = 0;
      do {
        uVar2 = local_68[sVar6];
        uVar1 = uVar7 + 1;
        puVar3 = puVar4;
        uVar13 = uVar5;
        if (uVar5 < uVar1) {
          uVar13 = uVar1 * 3 >> 1;
          if (uVar5 * 2 < uVar1) {
            uVar13 = uVar1;
          }
          puVar3 = (uchar *)realloc(puVar4,uVar13);
          if (puVar3 != (uchar *)0x0) goto LAB_00122a34;
        }
        else {
LAB_00122a34:
          puVar3[uVar7] = uVar2;
          uVar7 = uVar1;
          puVar4 = puVar3;
          uVar5 = uVar13;
        }
        sVar6 = sVar6 + 1;
      } while (sVar6 != local_70);
    }
    local_60.data = puVar4;
    local_60.size = uVar7;
    local_60.allocsize = uVar5;
    free(local_68);
    lodepng_add32bitInt(&local_60,uVar11);
  }
  *local_40 = local_60.data;
  *local_38 = local_60.size;
  return local_44;
}

Assistant:

unsigned lodepng_zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                               size_t insize, const LodePNGCompressSettings* settings)
{
  /*initially, *out must be NULL and outsize 0, if you just give some random *out
  that's pointing to a non allocated buffer, this'll crash*/
  ucvector outv;
  size_t i;
  unsigned error;
  unsigned char* deflatedata = 0;
  size_t deflatesize = 0;

  /*zlib data: 1 byte CMF (CM+CINFO), 1 byte FLG, deflate data, 4 byte ADLER32 checksum of the Decompressed data*/
  unsigned CMF = 120; /*0b01111000: CM 8, CINFO 7. With CINFO 7, any window size up to 32768 can be used.*/
  unsigned FLEVEL = 0;
  unsigned FDICT = 0;
  unsigned CMFFLG = 256 * CMF + FDICT * 32 + FLEVEL * 64;
  unsigned FCHECK = 31 - CMFFLG % 31;
  CMFFLG += FCHECK;

  /*ucvector-controlled version of the output buffer, for dynamic array*/
  ucvector_init_buffer(&outv, *out, *outsize);

  ucvector_push_back(&outv, (unsigned char)(CMFFLG >> 8));
  ucvector_push_back(&outv, (unsigned char)(CMFFLG & 255));

  error = deflate(&deflatedata, &deflatesize, in, insize, settings);

  if(!error)
  {
    unsigned ADLER32 = adler32(in, (unsigned)insize);
    for(i = 0; i != deflatesize; ++i) ucvector_push_back(&outv, deflatedata[i]);
    lodepng_free(deflatedata);
    lodepng_add32bitInt(&outv, ADLER32);
  }

  *out = outv.data;
  *outsize = outv.size;

  return error;
}